

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate.c
# Opt level: O0

double xc_integrate(integr_fn *func,void *ex,double a,double b)

{
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  int last;
  int *iord;
  int ierr;
  int neval;
  int limit;
  double *elist;
  double *rlist;
  double *blist;
  double *alist;
  double abserr;
  double result;
  double epsrel;
  double epsabs;
  double *in_stack_00000208;
  double *in_stack_00000210;
  double *in_stack_00000218;
  double *in_stack_00000220;
  void *in_stack_00000228;
  integr_fn *in_stack_00000230;
  int *in_stack_00000240;
  double *in_stack_00000248;
  double *in_stack_00000250;
  int *in_stack_00000258;
  int *in_stack_00000260;
  double *in_stack_00000268;
  double *in_stack_00000270;
  double *in_stack_00000278;
  double *in_stack_00000280;
  int *in_stack_00000288;
  int *in_stack_00000290;
  undefined8 local_68;
  
  __ptr = malloc(8000);
  __ptr_00 = malloc(8000);
  __ptr_01 = malloc(8000);
  __ptr_02 = malloc(8000);
  __ptr_03 = malloc(4000);
  xc_rdqagse(in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_00000218,
             in_stack_00000210,in_stack_00000208,in_stack_00000240,in_stack_00000248,
             in_stack_00000250,in_stack_00000258,in_stack_00000260,in_stack_00000268,
             in_stack_00000270,in_stack_00000278,in_stack_00000280,in_stack_00000288,
             in_stack_00000290);
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  free(__ptr_03);
  return local_68;
}

Assistant:

GPU_FUNCTION double xc_integrate(integr_fn func, void *ex, double a, double b)
{
  double epsabs, epsrel, result, abserr, *alist, *blist, *rlist, *elist;
  int limit, neval, ierr, *iord, last;

  epsabs = 1e-10;
  epsrel = 1e-10;

  limit  = 1000;
  alist = (double *)malloc(limit*sizeof(double));
  blist = (double *)malloc(limit*sizeof(double));
  rlist = (double *)malloc(limit*sizeof(double));
  elist = (double *)malloc(limit*sizeof(double));
  iord  = (int   *)malloc(limit*sizeof(int));

  xc_rdqagse(func, ex, &a, &b, &epsabs, &epsrel, &limit, &result, &abserr, &neval, &ierr,
	    alist, blist, rlist, elist, iord, &last);

  free(alist);
  free(blist);
  free(rlist);
  free(elist);
  free(iord);

  return result;
}